

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall
pfederc::LoopExpr::LoopExpr
          (LoopExpr *this,Lexer *lexer,ExprType type,Position *pos,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *initExpr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *condExpr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *itExpr,
          unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *bodyExpr)

{
  Expr *pEVar1;
  BodyExpr *pBVar2;
  size_t sVar3;
  Expr *pEVar4;
  
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = type;
  sVar3 = pos->startIndex;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = sVar3;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__LoopExpr_00127940;
  (this->initExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (initExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (initExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->condExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (condExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (condExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->itExpr)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
  .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (itExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
       .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (itExpr->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  (this->bodyExpr)._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (bodyExpr->_M_t).
       super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
       super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
  (bodyExpr->_M_t).super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>
  ._M_t.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl = (BodyExpr *)0x0;
  pEVar4 = (this->condExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar4 == (Expr *)0x0) {
    __assert_fail("this->condExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x29e,
                  "pfederc::LoopExpr::LoopExpr(const Lexer &, ExprType, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&)"
                 );
  }
  pEVar1 = (this->initExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1 == (Expr *)0x0) {
    if ((this->bodyExpr)._M_t.
        super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl == (BodyExpr *)0x0)
    goto LAB_0011b5c8;
  }
  else {
    if ((this->itExpr)._M_t.
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl == (Expr *)0x0) {
      __assert_fail("(!!this->initExpr && !!this->itExpr) || !this->initExpr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                    ,0x29f,
                    "pfederc::LoopExpr::LoopExpr(const Lexer &, ExprType, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&)"
                   );
    }
    if ((this->bodyExpr)._M_t.
        super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
        super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl == (BodyExpr *)0x0) {
LAB_0011b5c8:
      __assert_fail("!!this->bodyExpr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                    ,0x2a0,
                    "pfederc::LoopExpr::LoopExpr(const Lexer &, ExprType, const Position &, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<Expr> &&, std::unique_ptr<BodyExpr> &&)"
                   );
    }
    pEVar1->parent = &this->super_Expr;
    pEVar4 = (this->condExpr)._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  pEVar4->parent = &this->super_Expr;
  pEVar4 = (this->itExpr)._M_t.
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar4 != (Expr *)0x0) {
    pEVar4->parent = &this->super_Expr;
  }
  pBVar2 = (this->bodyExpr)._M_t.
           super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
           super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
           super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
  if (pBVar2 != (BodyExpr *)0x0) {
    (pBVar2->super_Expr).parent = &this->super_Expr;
  }
  return;
}

Assistant:

LoopExpr::LoopExpr(const Lexer &lexer, ExprType type, const Position &pos,
    std::unique_ptr<Expr> &&initExpr,
    std::unique_ptr<Expr> &&condExpr,
    std::unique_ptr<Expr> &&itExpr,
    std::unique_ptr<BodyExpr> &&bodyExpr) noexcept
    : Expr(lexer, type, pos), initExpr(std::move(initExpr)),
      condExpr(std::move(condExpr)), itExpr(std::move(itExpr)),
      bodyExpr(std::move(bodyExpr)) {
  assert(this->condExpr);
  assert((!!this->initExpr && !!this->itExpr) || !this->initExpr);
  assert(!!this->bodyExpr);

  _setParent(this->initExpr, this);
  this->condExpr->setParent(this);
  _setParent(this->itExpr, this);

  _setParent(this->bodyExpr, this);
}